

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetTxInIssuanceInfo
              (void *handle,char *tx_hex_string,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  bool bVar1;
  ConfidentialTransaction *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  int64_t iVar4;
  char *pcVar5;
  pointer puVar6;
  char *pcVar7;
  char *pcVar8;
  CfdException *this_00;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  Amount AVar13;
  char *work_asset_rangeproof;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  ConfidentialTxInReference ref;
  ConfidentialTransactionController ctxc;
  undefined1 local_2c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  ByteData local_2a8;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  ConfidentialValue local_260;
  char *local_238;
  char *local_230;
  undefined8 local_228;
  ConfidentialValue local_220;
  char **local_1f8;
  char **local_1f0;
  void *local_1e8;
  ConfidentialTxInReference local_1e0;
  ConfidentialTransactionController local_80;
  
  local_268 = (char *)0x0;
  local_270 = (char *)0x0;
  local_278 = (char *)0x0;
  local_280 = (char *)0x0;
  local_288 = (char *)0x0;
  local_228 = 0;
  local_1f8 = nonce;
  local_1f0 = entropy;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5e1cf2;
    local_1e0.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x259;
    local_1e0.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdGetTxInIssuanceInfo";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_1e0,kCfdLogLevelWarning,"tx is null or empty.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference =
         (_func_int **)&local_1e0.super_AbstractTxInReference.txid_.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_1e0);
    __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_1e0,tx_hex_string,(allocator *)&local_220);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&local_80,(string *)&local_1e0);
  if ((ByteData *)local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference !=
      &local_1e0.super_AbstractTxInReference.txid_.data_) {
    operator_delete(local_1e0.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  this = cfd::ConfidentialTransactionController::GetTransaction(&local_80);
  cfd::core::ConfidentialTransaction::GetTxIn(&local_1e0,this,index);
  if (local_1f0 == (char **)0x0) {
    local_230 = (char *)0x0;
  }
  else {
    local_2c8 = (undefined1  [8])0x0;
    paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_2b8._M_allocated_capacity = 0;
    uVar9 = (long)local_1e0.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      sVar12 = 0;
    }
    else {
      if ((long)uVar9 < 0) {
        std::__throw_bad_alloc();
      }
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(uVar9);
      sVar12 = (long)local_1e0.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1e0.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_2b8._M_allocated_capacity = (size_type)(paVar2->_M_local_buf + uVar9);
    local_2c8 = (undefined1  [8])paVar2;
    if (local_1e0.asset_entropy_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1e0.asset_entropy_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      paStack_2c0 = paVar2;
      memmove(paVar2,local_1e0.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar12);
    }
    paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar2->_M_local_buf + sVar12);
    cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_260,(ByteData256 *)local_2c8);
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_220,(BlindFactor *)&local_260);
    local_268 = cfd::capi::CreateString((string *)&local_220);
    local_230 = local_268;
    if (local_220._vptr_ConfidentialValue !=
        (_func_int **)
        ((long)&local_220.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_220._vptr_ConfidentialValue);
    }
    local_260._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_00723500;
    if (local_260.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2c8);
    }
  }
  if (local_1f8 == (char **)0x0) {
    local_238 = (char *)0x0;
  }
  else {
    local_2c8 = (undefined1  [8])0x0;
    paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_2b8._M_allocated_capacity = 0;
    uVar9 = (long)local_1e0.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      sVar12 = 0;
    }
    else {
      if ((long)uVar9 < 0) {
        std::__throw_bad_alloc();
      }
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(uVar9);
      sVar12 = (long)local_1e0.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1e0.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_2b8._M_allocated_capacity = (size_type)(paVar2->_M_local_buf + uVar9);
    local_2c8 = (undefined1  [8])paVar2;
    if (local_1e0.blinding_nonce_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1e0.blinding_nonce_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      paStack_2c0 = paVar2;
      memmove(paVar2,local_1e0.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar12);
    }
    paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar2->_M_local_buf + sVar12);
    cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_260,(ByteData256 *)local_2c8);
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_220,(BlindFactor *)&local_260);
    local_270 = cfd::capi::CreateString((string *)&local_220);
    local_238 = local_270;
    if (local_220._vptr_ConfidentialValue !=
        (_func_int **)
        ((long)&local_220.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_220._vptr_ConfidentialValue);
    }
    local_260._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_00723500;
    if (local_260.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2c8);
    }
  }
  cfd::core::ConfidentialValue::ConfidentialValue(&local_220,&local_1e0.issuance_amount_);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_260,&local_1e0.inflation_keys_);
  if (asset_amount != (int64_t *)0x0) {
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_220);
    if (!bVar1) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_220);
      if (bVar1) {
        iVar4 = 0;
      }
      else {
        AVar13 = cfd::core::ConfidentialValue::GetAmount(&local_220);
        local_2c8 = (undefined1  [8])AVar13.amount_;
        paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(paStack_2c0._1_7_,AVar13.ignore_check_);
        iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2c8);
      }
      *asset_amount = iVar4;
    }
  }
  if (asset_value == (char **)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2c8,&local_220);
    pcVar3 = cfd::capi::CreateString((string *)local_2c8);
    local_278 = pcVar3;
    if (local_2c8 != (undefined1  [8])&local_2b8) {
      operator_delete((void *)local_2c8);
    }
  }
  if (token_amount != (int64_t *)0x0) {
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_260);
    if (!bVar1) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_260);
      if (bVar1) {
        iVar4 = 0;
      }
      else {
        AVar13 = cfd::core::ConfidentialValue::GetAmount(&local_260);
        local_2c8 = (undefined1  [8])AVar13.amount_;
        paStack_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(paStack_2c0._1_7_,AVar13.ignore_check_);
        iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2c8);
      }
      *token_amount = iVar4;
    }
  }
  if (token_value == (char **)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2c8,&local_260);
    pcVar5 = cfd::capi::CreateString((string *)local_2c8);
    local_280 = pcVar5;
    if (local_2c8 != (undefined1  [8])&local_2b8) {
      operator_delete((void *)local_2c8);
    }
  }
  if (asset_rangeproof == (char **)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = (long)local_1e0.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      puVar6 = (pointer)0x0;
      sVar12 = 0;
    }
    else {
      if ((long)uVar9 < 0) {
        std::__throw_bad_alloc();
      }
      puVar6 = (pointer)operator_new(uVar9);
      sVar12 = (long)local_1e0.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1e0.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6 + uVar9;
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    if (local_1e0.issuance_amount_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1e0.issuance_amount_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      memmove(puVar6,local_1e0.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar12);
    }
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6 + sVar12;
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2c8,&local_2a8);
    pcVar7 = cfd::capi::CreateString((string *)local_2c8);
    local_288 = pcVar7;
    if (local_2c8 != (undefined1  [8])&local_2b8) {
      operator_delete((void *)local_2c8);
    }
    if (local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (token_rangeproof == (char **)0x0) {
    pcVar8 = (char *)0x0;
    pcVar10 = local_230;
    pcVar11 = local_238;
  }
  else {
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = (long)local_1e0.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_1e8 = handle;
    if (uVar9 == 0) {
      puVar6 = (pointer)0x0;
      sVar12 = 0;
    }
    else {
      if ((long)uVar9 < 0) {
        std::__throw_bad_alloc();
      }
      puVar6 = (pointer)operator_new(uVar9);
      sVar12 = (long)local_1e0.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1e0.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6 + uVar9;
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    if (local_1e0.inflation_keys_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1e0.inflation_keys_rangeproof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      memmove(puVar6,local_1e0.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar12);
    }
    local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6 + sVar12;
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2c8,&local_2a8);
    pcVar8 = cfd::capi::CreateString((string *)local_2c8);
    pcVar10 = local_230;
    pcVar11 = local_238;
    if (local_2c8 != (undefined1  [8])&local_2b8) {
      operator_delete((void *)local_2c8);
    }
    if (local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (pcVar10 != (char *)0x0) {
    *local_1f0 = pcVar10;
  }
  if (pcVar11 != (char *)0x0) {
    *local_1f8 = pcVar11;
  }
  if (pcVar3 != (char *)0x0) {
    *asset_value = pcVar3;
  }
  if (pcVar5 != (char *)0x0) {
    *token_value = pcVar5;
  }
  if (pcVar7 != (char *)0x0) {
    *asset_rangeproof = pcVar7;
  }
  if (pcVar8 != (char *)0x0) {
    *token_rangeproof = pcVar8;
  }
  local_260._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  if (local_260.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_220._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  if (local_220.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_220.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_1e0);
  local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_007233d8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_80.transaction_);
  return 0;
}

Assistant:

int CfdGetTxInIssuanceInfo(
    void* handle, const char* tx_hex_string, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();
    const ConfidentialTxInReference ref = tx.GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}